

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

pair<bool,_unsigned_long> __thiscall
LiteralTokenizerRule::tryMatch(LiteralTokenizerRule *this,shared_ptr<Readable> *reader)

{
  char cVar1;
  element_type *peVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  size_type sVar4;
  ulong uVar5;
  bool bVar6;
  pair<bool,_unsigned_long> pVar7;
  
  bVar6 = (this->literal)._M_string_length != 0;
  if (bVar6) {
    uVar5 = 0;
    do {
      cVar1 = (this->literal)._M_dataplus._M_p[uVar5];
      peVar2 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar3 = (*peVar2->_vptr_Readable[2])(peVar2,uVar5);
      in_RAX = CONCAT44(extraout_var,iVar3);
      if (cVar1 != (char)iVar3) {
        if (bVar6) goto LAB_00114014;
        break;
      }
      uVar5 = uVar5 + 1;
      bVar6 = uVar5 < (this->literal)._M_string_length;
    } while (bVar6);
  }
  if (this->nextCharMustBeNonAlpha == true) {
    peVar2 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar3 = (*peVar2->_vptr_Readable[2])(peVar2,(this->literal)._M_string_length);
    cVar1 = (char)iVar3;
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
LAB_00114014:
      in_RAX = 0;
      sVar4 = 0;
      goto LAB_0011403d;
    }
    in_RAX = 0;
    sVar4 = 0;
    if ((((byte)(cVar1 - 0x30U) < 10) || (cVar1 == '_')) ||
       (sVar4 = 0, (byte)(cVar1 + 0xbfU) < 0x1a)) goto LAB_0011403d;
  }
  sVar4 = (this->literal)._M_string_length;
  in_RAX = CONCAT71((int7)((ulong)in_RAX >> 8),1);
LAB_0011403d:
  pVar7.second = sVar4;
  pVar7._0_8_ = in_RAX;
  return pVar7;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    for (std::size_t i = 0; i < this->literal.length(); i++) {
      if (this->literal.at(i) != reader->charAt(i)) {
        return std::make_pair(false, 0);
      }
    }

    if (this->nextCharMustBeNonAlpha && isLiteralRest(reader->charAt(this->literal.size()))) {
      return std::make_pair(false, 0);
    }

    return std::make_pair(true, this->literal.length());
  }